

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxsender.h
# Opt level: O0

void quicly_maxsender_acked(quicly_maxsender_t *m,quicly_maxsender_sent_t *sent)

{
  ulong *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) < (long)(*in_RSI >> 1)) {
    *(ulong *)(in_RDI + 8) = *in_RSI >> 1;
  }
  if ((*in_RSI & 1) != 0) {
    if (*(long *)(in_RDI + 0x10) == 0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x77,
                    "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -1;
    *in_RSI = *in_RSI & 0xfffffffffffffffe;
  }
  return;
}

Assistant:

inline void quicly_maxsender_acked(quicly_maxsender_t *m, quicly_maxsender_sent_t *sent)
{
    if (m->max_acked < (int64_t)sent->value)
        m->max_acked = sent->value;
    /* num_inflight should not be adjusted in case of a late ACK */
    if (sent->inflight) {
        assert(m->num_inflight != 0);
        --m->num_inflight;
        sent->inflight = 0;
    }
}